

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::fix_scrollbar_order(Fl_Tree *this)

{
  uint uVar1;
  Fl_Widget **ppFVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  ppFVar2 = Fl_Group::array(&this->super_Fl_Group);
  uVar1 = (this->super_Fl_Group).children_;
  if ((Fl_Scrollbar *)ppFVar2[(long)(int)uVar1 + -1] != this->_vscroll) {
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    iVar5 = 0;
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if ((Fl_Scrollbar *)ppFVar2[uVar4] != this->_vscroll) {
        ppFVar2[iVar5] = ppFVar2[uVar4];
        iVar5 = iVar5 + 1;
      }
    }
    ppFVar2[iVar5] = (Fl_Widget *)this->_vscroll;
  }
  return;
}

Assistant:

void Fl_Tree::fix_scrollbar_order() {
  Fl_Widget** a = (Fl_Widget**)array();
  if (a[children()-1] != _vscroll) {
    int i,j;
#if FLTK_ABI_VERSION >= 10303
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll && a[j] != _hscroll ) a[i++] = a[j];
    }
    a[i++] = _hscroll;
    a[i++] = _vscroll;
#else
    for (i = j = 0; j < children(); j++) {
      if (a[j] != _vscroll) a[i++] = a[j];
    }
    a[i++] = _vscroll;
#endif
  }
}